

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
process_final_deregs_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this)

{
  _Elt_pointer ppcVar1;
  _Elt_pointer ppcVar2;
  _Map_pointer pppcVar3;
  _Elt_pointer ppcVar4;
  final_dereg_coop_container_t coops;
  _Deque_impl_data local_80;
  
  while ((this->m_final_dereg_coops).
         super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->m_final_dereg_coops).
         super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::_Deque_base
              ((_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&local_80);
    std::swap<std::_Deque_base<so_5::coop_t*,std::allocator<so_5::coop_t*>>::_Deque_impl_data>
              (&local_80,(_Deque_impl_data *)&this->m_final_dereg_coops);
    ppcVar1 = local_80._M_finish._M_cur;
    ppcVar2 = local_80._M_start._M_cur;
    pppcVar3 = local_80._M_start._M_node;
    ppcVar4 = local_80._M_start._M_last;
    while (ppcVar2 != ppcVar1) {
      coop_t::final_deregister_coop(*ppcVar2);
      ppcVar2 = ppcVar2 + 1;
      if (ppcVar2 == ppcVar4) {
        ppcVar2 = pppcVar3[1];
        pppcVar3 = pppcVar3 + 1;
        ppcVar4 = ppcVar2 + 0x40;
      }
    }
    std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::~_Deque_base
              ((_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&local_80);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::process_final_deregs_if_any()
	{
		// This loop is necessary because it is possible that new
		// final dereg demand will be added during processing of
		// the current final dereg demand.
		while( !m_final_dereg_coops.empty() )
			{
				final_dereg_coop_container_t coops;
				coops.swap( m_final_dereg_coops );

				for( auto ptr : coops )
					coop_t::call_final_deregister_coop( ptr );
			}
	}